

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDar(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    pMan_00 = Abc_NtkToDar(pNtk,0,0);
    if (pMan_00 == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk_local = Abc_NtkFromDar(pNtk,pMan_00);
      Aig_ManStop(pMan_00);
      if ((pNtk_local != (Abc_Ntk_t *)0x0) && (iVar1 = Abc_NtkCheck(pNtk_local), iVar1 == 0)) {
        Abc_Print(1,"Abc_NtkDar: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x56f,"Abc_Ntk_t *Abc_NtkDar(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDar( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig = NULL;
    Aig_Man_t * pMan;
    extern void Fra_ManPartitionTest( Aig_Man_t * p, int nComLim );

    assert( Abc_NtkIsStrash(pNtk) );
    // convert to the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;

    // perform computation
//    Fra_ManPartitionTest( pMan, 4 );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );

    // make sure everything is okay
    if ( pNtkAig && !Abc_NtkCheck( pNtkAig ) )
    {
        Abc_Print( 1, "Abc_NtkDar: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}